

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::MergePartialFromCodedStream
          (WordEmbedding *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  int64 iVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  
  this_00 = &this->modelparameterdata_;
  this_01 = &this->language_;
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_0014a9ae;
        uVar11 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_0014a9ae:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar6 = (uint32)uVar11;
    iVar8 = 6;
    iVar9 = iVar8;
    if ((uVar11 & 0x100000000) == 0) {
LAB_0014a8a6:
      iVar9 = 7;
      if ((uVar6 & 7) != 4 && uVar6 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_0014a8c5:
        iVar9 = iVar8;
        if (bVar4 != false) goto LAB_0014a8cc;
      }
    }
    else {
      uVar5 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar10 = (char)uVar11;
      if (uVar5 == 100) {
        if (cVar10 != '\"') goto LAB_0014a8a6;
        if (this_00->ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
        goto LAB_0014a8c5;
      }
      if (uVar5 == 10) {
        if (cVar10 != 'R') goto LAB_0014a8a6;
        if (this_01->ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_01->ptr_);
        if (bVar4) {
          bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,
                             PARSE,"CoreML.Specification.CoreMLModels.WordEmbedding.language");
          goto LAB_0014a8c5;
        }
        goto LAB_0014a8ce;
      }
      if ((uVar5 != 1) || (cVar10 != '\b')) goto LAB_0014a8a6;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar6 = (uint32)bVar2;
        if (-1 < (char)bVar2) {
          this->revision_ = (uint)bVar2;
          input->buffer_ = pbVar3 + 1;
          goto LAB_0014a8cc;
        }
      }
      else {
        uVar6 = 0;
      }
      iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
      this->revision_ = (uint32)iVar7;
      if (-1 < iVar7) {
LAB_0014a8cc:
        iVar9 = 0;
      }
    }
LAB_0014a8ce:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool WordEmbedding::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordEmbedding.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.WordEmbedding)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.WordEmbedding)
  return false;
#undef DO_
}